

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O1

void __thiscall UnitTest_semantic13::Run(UnitTest_semantic13 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  string local_60;
  long *local_40;
  long *local_38;
  long *local_30;
  long *local_28;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"a = -#{1, 2, 3} + 1","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_28,&local_60);
  plVar2 = local_28;
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))(local_28);
  }
  local_28 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (plVar2 == (long *)0x0) {
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"\'Semantic(\"a = -#{1, 2, 3} + 1\")\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"a = (1 > 2) + 1","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_30,&local_60);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  local_30 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "\'{ Semantic(\"a = (1 > 2) + 1\"); }\' has no luna::SemanticException","");
  UnitTestBase::Error(&this->super_UnitTestBase,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"a = (1 ~= 2) > 1","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_38,&local_60);
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  local_38 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "\'{ Semantic(\"a = (1 ~= 2) > 1\"); }\' has no luna::SemanticException","");
  UnitTestBase::Error(&this->super_UnitTestBase,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"a = not a >= true","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_40,&local_60);
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 8))();
  }
  local_40 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "\'{ Semantic(\"a = not a >= true\"); }\' has no luna::SemanticException","");
  UnitTestBase::Error(&this->super_UnitTestBase,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_CASE(semantic13)
{
    EXPECT_TRUE(Semantic("a = -#{1, 2, 3} + 1"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = (1 > 2) + 1");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = (1 ~= 2) > 1");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = not a >= true");
    });
}